

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmw<unsigned_long,unsigned_short>
          (Thread *this,BinopFunc<unsigned_short,_unsigned_short> *f,Instr instr,Ptr *out_trap)

{
  ushort uVar1;
  pointer puVar2;
  Store *this_00;
  Memory *pMVar3;
  unsigned_short uVar4;
  RunResult RVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  Value VVar9;
  Value VVar10;
  Value value;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  VVar9 = Pop(this);
  VVar10 = Pop(this);
  pMVar3 = local_80.obj_;
  uVar8 = (ulong)instr.field_2.imm_u32x2.snd;
  if ((VVar10.i32_ + instr.field_2.imm_u32x2.snd & 1) == 0) {
    uVar6 = VVar10.i64_ & 0xffffffff;
    uVar7 = uVar6 + uVar8 + 2;
    puVar2 = ((local_80.obj_)->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar7 <= (ulong)((long)((local_80.obj_)->data_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
      uVar1 = *(ushort *)(puVar2 + uVar8 + uVar6);
      value.i64_._2_6_ = 0;
      value.i32_._0_2_ = uVar1;
      uVar4 = (*f)(uVar1,VVar9._0_2_);
      puVar2 = (pMVar3->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      value._8_8_ = (long)(pMVar3->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar2;
      if (uVar7 <= value._8_8_) {
        *(unsigned_short *)(puVar2 + uVar8 + uVar6) = uVar4;
        Push(this,value);
        RVar5 = Ok;
        goto LAB_0015d9b8;
      }
    }
  }
  this_00 = this->store_;
  StringPrintf_abi_cxx11_
            (&local_68,"invalid atomic access at %u+%u",VVar10.i64_ & 0xffffffff,
             (ulong)instr.field_2.imm_u32x2.snd);
  Store::
  Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
            (&local_48,this_00,this_00,&local_68,&this->frames_);
  out_trap->obj_ = local_48.obj_;
  out_trap->store_ = local_48.store_;
  out_trap->root_index_ = local_48.root_index_;
  local_48.obj_ = (Trap *)0x0;
  local_48.store_ = (Store *)0x0;
  local_48.root_index_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  RVar5 = Trap;
LAB_0015d9b8:
  if (local_80.obj_ != (Memory *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_80.store_)->roots_,local_80.root_index_);
  }
  return RVar5;
}

Assistant:

RunResult Thread::DoAtomicRmw(BinopFunc<T, T> f,
                              Instr instr,
                              Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  T val = Pop<T>();
  u32 offset = Pop<u32>();
  T old;
  TRAP_IF(Failed(memory->AtomicRmw(offset, instr.imm_u32x2.snd, val, f, &old)),
          StringPrintf("invalid atomic access at %u+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<R>(old));
  return RunResult::Ok;
}